

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

ScriptFunctionWithInlineCache * __thiscall
Js::JavascriptLibrary::CreateScriptFunctionWithInlineCache
          (JavascriptLibrary *this,FunctionProxy *proxy)

{
  bool bVar1;
  Recycler *pRVar2;
  JavascriptLibrary *pJVar3;
  InfoBitsWrapper<(Memory::ObjectInfoBits)133> local_e9;
  TrackAllocData local_e8;
  InfoBitsWrapper<(Memory::ObjectInfoBits)133> local_b9;
  TrackAllocData local_b8;
  InfoBitsWrapper<(Memory::ObjectInfoBits)133> local_89;
  TrackAllocData local_88;
  InfoBitsWrapper<(Memory::ObjectInfoBits)133> local_59;
  TrackAllocData local_58;
  FunctionInfo *local_30;
  FunctionInfo *functionInfo;
  ScriptFunctionType *deferredPrototypeType;
  FunctionProxy *proxy_local;
  JavascriptLibrary *this_local;
  
  deferredPrototypeType = (ScriptFunctionType *)proxy;
  proxy_local = (FunctionProxy *)this;
  functionInfo = (FunctionInfo *)FunctionProxy::EnsureDeferredPrototypeType(proxy);
  local_30 = FunctionProxy::GetFunctionInfo((FunctionProxy *)deferredPrototypeType);
  bVar1 = FunctionInfo::HasComputedName(local_30);
  if ((bVar1) || (bVar1 = FunctionInfo::HasHomeObj(local_30), bVar1)) {
    bVar1 = FunctionInfo::HasComputedName(local_30);
    if ((bVar1) && (bVar1 = FunctionInfo::HasHomeObj(local_30), bVar1)) {
      pRVar2 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                 ,0x1912);
      pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_58);
      pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)133>(0x80,pRVar2,&local_59);
      FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::
      FunctionWithComputedName
                ((FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
                  *)pJVar3,(FunctionProxy *)deferredPrototypeType,(ScriptFunctionType *)functionInfo
                );
      this_local = pJVar3;
    }
    else {
      bVar1 = FunctionInfo::HasHomeObj(local_30);
      if (bVar1) {
        pRVar2 = GetRecycler(this);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_88,
                   (type_info *)&FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                   ,0x1916);
        pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_88);
        pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)133>(0x78,pRVar2,&local_89);
        FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::FunctionWithHomeObj
                  ((FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache> *)pJVar3,
                   (FunctionProxy *)deferredPrototypeType,(ScriptFunctionType *)functionInfo);
        this_local = pJVar3;
      }
      else {
        pRVar2 = GetRecycler(this);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_b8,
                   (type_info *)
                   &FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                   ,0x1918);
        pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_b8);
        pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)133>(0x78,pRVar2,&local_b9);
        FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>::FunctionWithComputedName
                  ((FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *)pJVar3,
                   (FunctionProxy *)deferredPrototypeType,(ScriptFunctionType *)functionInfo);
        this_local = pJVar3;
      }
    }
  }
  else {
    pRVar2 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e8,(type_info *)&ScriptFunctionWithInlineCache::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x191a);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_e8);
    pJVar3 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)133>(0x70,pRVar2,&local_e9);
    ScriptFunctionWithInlineCache::ScriptFunctionWithInlineCache
              ((ScriptFunctionWithInlineCache *)pJVar3,(FunctionProxy *)deferredPrototypeType,
               (ScriptFunctionType *)functionInfo);
    this_local = pJVar3;
  }
  return (ScriptFunctionWithInlineCache *)this_local;
}

Assistant:

ScriptFunctionWithInlineCache* JavascriptLibrary::CreateScriptFunctionWithInlineCache(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), FunctionWithComputedName<FunctionWithHomeObj<ScriptFunctionWithInlineCache>>, proxy, deferredPrototypeType);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), FunctionWithHomeObj<ScriptFunctionWithInlineCache>, proxy, deferredPrototypeType);
            }
            return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), ScriptFunctionWithInlineCacheAndComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), ScriptFunctionWithInlineCache, proxy, deferredPrototypeType);
    }